

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.h
# Opt level: O3

void __thiscall ipx::Basis::FixNonbasicVariable(Basis *this,Int j)

{
  pointer piVar1;
  
  piVar1 = (this->map2basis_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (-2 < piVar1[j]) {
    piVar1[j] = -2;
  }
  return;
}

Assistant:

inline Basis::BasicStatus Basis::StatusOf(Int j) const {
    const Int m = model_.rows();
    const Int p = map2basis_[j];
    assert(p >= -2 && p < 2*m);
    if (p < 0)
        return p == -1 ? NONBASIC : NONBASIC_FIXED;
    else
        return p < m ? BASIC : BASIC_FREE;
}